

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

double __thiscall HVectorBase<double>::norm2(HVectorBase<double> *this)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  long in_RDI;
  double value;
  HighsInt i;
  double result;
  double *workArray;
  HighsInt *workIndex;
  HighsInt workCount;
  int local_2c;
  double local_28;
  
  iVar1 = *(int *)(in_RDI + 4);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),0);
  local_28 = 0.0;
  for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
    local_28 = pvVar3[pvVar2[local_2c]] * pvVar3[pvVar2[local_2c]] + local_28;
  }
  return local_28;
}

Assistant:

Real HVectorBase<Real>::norm2() const {
  /*
   * Compute the squared 2-norm of the vector
   */
  const HighsInt workCount = count;
  const HighsInt* workIndex = &index[0];
  const Real* workArray = &array[0];

  Real result = Real{0};
  for (HighsInt i = 0; i < workCount; i++) {
    Real value = workArray[workIndex[i]];
    result += value * value;
  }
  return result;
}